

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall Application::toApp(Application *this,Message *message,SessionID *sessionID)

{
  bool bVar1;
  ostream *poVar2;
  DoNotSend *this_00;
  allocator<char> local_a1;
  string local_a0;
  PossDupFlag possDupFlag;
  
  FIX::PossDupFlag::PossDupFlag(&possDupFlag);
  FIX::FieldMap::getField((FieldMap *)(message + 0x70),(FieldBase *)&possDupFlag);
  bVar1 = FIX::BoolField::getValue(&possDupFlag.super_BoolField);
  if (!bVar1) {
    FIX::FieldBase::~FieldBase((FieldBase *)&possDupFlag);
    poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar2 = std::operator<<(poVar2,"OUT: ");
    poVar2 = FIX::operator<<(poVar2,message);
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  this_00 = (DoNotSend *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
  FIX::DoNotSend::DoNotSend(this_00,&local_a0);
  __cxa_throw(this_00,&FIX::DoNotSend::typeinfo,FIX::Exception::~Exception);
}

Assistant:

EXCEPT(FIX::DoNotSend) {
  try {
    FIX::PossDupFlag possDupFlag;
    message.getHeader().getField(possDupFlag);
    if (possDupFlag) {
      throw FIX::DoNotSend();
    }
  } catch (FIX::FieldNotFound &) {}

  std::cout << std::endl << "OUT: " << message << std::endl;
}